

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_format_priv.h
# Opt level: O3

void _ST_PRIVATE::format_numeric_s<signed_char>
               (format_spec *format,format_writer *output,char value)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  byte bVar6;
  long lVar4;
  out_of_range *this;
  undefined8 uVar5;
  byte bVar7;
  byte bVar8;
  long lVar9;
  ulong auStack_90 [2];
  code *pcStack_80;
  code *pcStack_78;
  format_spec fStack_6c;
  byte local_21 [9];
  byte *local_18;
  
  switch(format->digit_class) {
  case digit_default:
  case digit_dec:
    bVar7 = 10;
    break;
  case digit_hex:
    bVar7 = 0x10;
    break;
  case digit_hex_upper:
    bVar7 = 0x10;
    bVar3 = true;
    goto LAB_001ebee4;
  case digit_oct:
    bVar7 = 8;
    break;
  case digit_bin:
    bVar7 = 2;
    break;
  default:
    format_numeric_s<signed_char>();
    auStack_90[1] = 0;
    auStack_90[0] = (ulong)*(byte *)&output->_vptr_format_writer;
    pcStack_78 = std::
                 _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
                 ::_M_invoke;
    pcStack_80 = std::
                 _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
                 ::_M_manager;
    lVar9 = 0;
    while( true ) {
      bVar3 = ST::format_writer::next_format((format_writer *)format);
      if (!bVar3) {
        if (pcStack_80 != (code *)0x0) {
          (*pcStack_80)(auStack_90,auStack_90,3);
        }
        return;
      }
      ST::format_writer::parse_format(&fStack_6c,(format_writer *)format);
      iVar2 = fStack_6c.arg_index;
      lVar4 = (long)fStack_6c.arg_index + -1;
      if ((long)fStack_6c.arg_index < 0) {
        lVar4 = lVar9;
      }
      if (lVar4 != 0) break;
      if (pcStack_80 == (code *)0x0) {
        uVar5 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar5);
      }
      (*pcStack_78)(auStack_90,&fStack_6c,format);
      lVar9 = lVar9 + (ulong)((uint)iVar2 >> 0x1f);
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Parameter index out of range");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  bVar3 = false;
LAB_001ebee4:
  local_21[1] = 0;
  if (value == '\0') {
    local_18 = local_21;
    local_21[0] = 0x30;
  }
  else {
    bVar8 = (value ^ value >> 7) - (value >> 7);
    local_18 = local_21 + 1;
    do {
      bVar6 = bVar8 % bVar7;
      local_18 = local_18 + -1;
      if (bVar6 < 10) {
        bVar6 = bVar6 | 0x30;
      }
      else if (bVar3) {
        bVar6 = bVar6 + 0x37;
      }
      else {
        bVar6 = bVar6 + 0x57;
      }
      *local_18 = bVar6;
      bVar1 = bVar7 <= bVar8;
      bVar8 = bVar8 / bVar7;
    } while (bVar1);
  }
  bVar7 = 2;
  if (value != '\0') {
    bVar7 = (byte)value >> 7;
  }
  format_numeric_string
            (format,output,(char *)local_18,(long)(local_21 + 1) - (long)local_18,(uint)bVar7);
  return;
}

Assistant:

void format_numeric_s(const ST::format_spec &format,
                          ST::format_writer &output, int_T value)
    {
        static_assert(std::is_signed<int_T>::value,
                      "Use _format_numeric_u for unsigned numerics");

        int radix = 10;
        bool upper_case = false;
        switch (format.digit_class) {
        case ST::digit_hex_upper:
            upper_case = true;
            /* fall through */
        case ST::digit_hex:
            radix = 16;
            break;
        case ST::digit_oct:
            radix = 8;
            break;
        case ST::digit_bin:
            radix = 2;
            break;
        case ST::digit_dec:
        case ST::digit_default:
            break;
        default:
            ST_ASSERT(false, "Invalid digit class for _format_numeric_s");
        }

        typedef typename std::make_unsigned<int_T>::type uint_T;
        ST::uint_formatter<uint_T> formatter;
        formatter.format(static_cast<uint_T>(std::abs(value)), radix, upper_case);

        const numeric_type ntype = (value == 0) ? numeric_zero
                                 : (value < 0) ? numeric_negative
                                 : numeric_positive;

        format_numeric_string(format, output, formatter.text(), formatter.size(), ntype);
    }